

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O2

void __thiscall edition_unittest::TestOneof2::clear_foo(TestOneof2 *this)

{
  uint32_t uVar1;
  long *plVar2;
  Cord *this_00;
  ulong uVar3;
  
  uVar1 = (this->field_0)._impl_._oneof_case_[0];
  switch(uVar1) {
  case 2:
  case 3:
  case 4:
  case 5:
    google::protobuf::internal::ArenaStringPtr::Destroy(&(this->field_0)._impl_.foo_.foo_string_);
    break;
  case 6:
  case 9:
  case 10:
    break;
  case 7:
  case 8:
  case 0xb:
    uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
    if ((uVar3 & 1) != 0) {
      uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
    }
    plVar2 = *(long **)((long)&this->field_0 + 0x18);
    if (uVar3 == 0) {
      if (plVar2 != (long *)0x0) {
        (**(code **)(*plVar2 + 8))();
      }
    }
    else if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 0x10))();
    }
    break;
  default:
    if (uVar1 == 0x1e) {
      uVar3 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
      if ((uVar3 & 1) != 0) {
        uVar3 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
      }
      if (uVar3 == 0) {
        this_00 = *(Cord **)((long)&this->field_0 + 0x18);
        if (this_00 != (Cord *)0x0) {
          absl::lts_20250127::Cord::~Cord(this_00);
        }
        operator_delete(this_00,0x10);
      }
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestOneof2::clear_foo() {
// @@protoc_insertion_point(one_of_clear_start:edition_unittest.TestOneof2)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (foo_case()) {
    case kFooInt: {
      // No need to clear
      break;
    }
    case kFooString: {
      _impl_.foo_.foo_string_.Destroy();
      break;
    }
    case kFooCord: {
      _impl_.foo_.foo_cord_.Destroy();
      break;
    }
    case kFooStringPiece: {
      _impl_.foo_.foo_string_piece_.Destroy();
      break;
    }
    case kFooBytes: {
      _impl_.foo_.foo_bytes_.Destroy();
      break;
    }
    case kFooEnum: {
      // No need to clear
      break;
    }
    case kFooMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foo_message_);
      }
      break;
    }
    case kFoogroup: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foogroup_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foogroup_);
      }
      break;
    }
    case kFooLazyMessage: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_lazy_message_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.foo_.foo_lazy_message_);
      }
      break;
    }
    case kFooBytesCord: {
      if (GetArena() == nullptr) {
        delete _impl_.foo_.foo_bytes_cord_;
      }
      break;
    }
    case FOO_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = FOO_NOT_SET;
}